

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<TPZFNMatrix<9,_double>,_18>::~TPZManVector
          (TPZManVector<TPZFNMatrix<9,_double>,_18> *this)

{
  void *in_RDI;
  TPZManVector<TPZFNMatrix<9,_double>,_18> *unaff_retaddr;
  
  ~TPZManVector(unaff_retaddr);
  operator_delete(in_RDI,0xfe0);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}